

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

string * __thiscall
llvm::yaml::Node::getVerbatimTag_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  pointer pDVar4;
  map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
  *pmVar5;
  pointer ppVar6;
  unsigned_long *puVar7;
  string *psVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  StringRef string;
  StringRef string_00;
  StringRef string_01;
  allocator local_415;
  allocator local_414;
  allocator local_413;
  allocator local_412;
  allocator local_411;
  string *local_410;
  char *local_408;
  Twine local_400;
  Twine local_3e8;
  Twine local_3d0;
  undefined1 local_3b8 [8];
  Token T;
  _Self local_360;
  _Self local_358;
  const_iterator It;
  StringRef TagHandle;
  key_type local_330;
  _Rb_tree_const_iterator<std::pair<const_llvm::StringRef,_llvm::StringRef>_> local_320;
  string local_318;
  char *local_2f8;
  string *local_2e0;
  char *local_2d8;
  key_type local_2d0;
  _Rb_tree_const_iterator<std::pair<const_llvm::StringRef,_llvm::StringRef>_> local_2c0;
  string local_2b8;
  undefined1 local_291;
  char *local_290;
  char *local_280;
  char *local_278;
  undefined1 local_270 [8];
  StringRef Raw;
  Node *this_local;
  string *Ret;
  char *local_1a8;
  char *local_1a0;
  unsigned_long local_198 [3];
  StringRef *local_180;
  undefined1 local_178 [16];
  char *local_168;
  string *local_160;
  undefined1 *local_158;
  unsigned_long local_150;
  unsigned_long local_148;
  unsigned_long local_140;
  StringRef *local_138;
  undefined1 local_130 [16];
  char *local_120;
  _Base_ptr local_118;
  undefined1 *local_110;
  unsigned_long local_108 [3];
  undefined1 *local_f0;
  undefined1 local_e8 [16];
  char *local_d8;
  string *local_d0;
  undefined1 *local_c8;
  unsigned_long local_c0 [3];
  undefined1 *local_a8;
  undefined1 local_a0 [16];
  char *local_90;
  string *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char **local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  Raw.Length = (size_t)this;
  _local_270 = getRawTag(this);
  bVar10 = false;
  if (Raw.Data != (char *)0x0) {
    local_280 = (char *)local_270;
    local_278 = Raw.Data;
    local_290 = "!";
    local_50 = (char *)strlen("!");
    local_1a8 = local_280;
    local_1a0 = local_278;
    local_58 = local_290;
    local_60 = &local_1a8;
    bVar10 = false;
    if (local_278 == local_50) {
      local_38 = local_280;
      local_40 = local_290;
      local_48 = local_50;
      if (local_50 == (char *)0x0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(local_280,local_290,(size_t)local_50);
      }
      bVar10 = local_2c == 0;
    }
    bVar10 = (bool)(bVar10 ^ 1);
  }
  if (bVar10) {
    local_291 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    sVar3 = StringRef::find_last_of((StringRef *)local_270,'!',0xffffffffffffffff);
    if (sVar3 == 0) {
      pDVar4 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
               operator->(this->Doc);
      pmVar5 = Document::getTagMap(pDVar4);
      local_2d0.Data = "!";
      local_2d0.Length = strlen("!");
      local_2c0._M_node =
           (_Base_ptr)
           std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::find(pmVar5,&local_2d0);
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>::
               operator->(&local_2c0);
      StringRef::operator_cast_to_string(&local_2b8,&ppVar6->second);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      local_a8 = local_270;
      local_c0[2] = 1;
      local_c0[1] = 0xffffffffffffffff;
      puVar7 = std::min<unsigned_long>(local_c0 + 2,(unsigned_long *)&Raw);
      local_c0[2] = *puVar7;
      psVar8 = (string *)((long)local_270 + local_c0[2]);
      local_c0[0] = (long)Raw.Data - local_c0[2];
      puVar7 = std::min<unsigned_long>(local_c0 + 1,local_c0);
      local_2d8 = (char *)*puVar7;
      local_80 = local_a0;
      string.Length = (size_t)psVar8;
      string.Data = local_2d8;
      local_2e0 = psVar8;
      local_90 = local_2d8;
      local_88 = psVar8;
      llvm::operator+=((llvm *)__return_storage_ptr__,psVar8,string);
    }
    else {
      local_2f8 = "!!";
      local_68 = (char *)strlen("!!");
      local_70 = local_2f8;
      local_78 = local_270;
      bVar10 = false;
      if (local_68 <= Raw.Data) {
        local_18 = (char *)local_270;
        local_20 = local_2f8;
        local_28 = local_68;
        if (local_68 == (char *)0x0) {
          local_c = 0;
        }
        else {
          local_c = memcmp((void *)local_270,local_2f8,(size_t)local_68);
        }
        bVar10 = local_c == 0;
      }
      if (bVar10) {
        pDVar4 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
                 operator->(this->Doc);
        pmVar5 = Document::getTagMap(pDVar4);
        local_330.Data = "!!";
        local_330.Length = strlen("!!");
        local_320._M_node =
             (_Base_ptr)
             std::
             map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
             ::find(pmVar5,&local_330);
        ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>::
                 operator->(&local_320);
        StringRef::operator_cast_to_string(&local_318,&ppVar6->second);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        local_f0 = local_270;
        local_108[2] = 2;
        local_108[1] = 0xffffffffffffffff;
        puVar7 = std::min<unsigned_long>(local_108 + 2,(unsigned_long *)&Raw);
        local_108[2] = *puVar7;
        psVar8 = (string *)((long)local_270 + local_108[2]);
        local_108[0] = (long)Raw.Data - local_108[2];
        puVar7 = std::min<unsigned_long>(local_108 + 1,local_108);
        local_d8 = (char *)*puVar7;
        local_c8 = local_e8;
        string_00.Length = (size_t)psVar8;
        string_00.Data = local_d8;
        local_d0 = psVar8;
        llvm::operator+=((llvm *)__return_storage_ptr__,psVar8,string_00);
      }
      else {
        sVar3 = StringRef::find_last_of((StringRef *)local_270,'!',0xffffffffffffffff);
        local_148 = sVar3 + 1;
        local_140 = 0;
        local_138 = (StringRef *)local_270;
        puVar7 = std::min<unsigned_long>(&local_140,(unsigned_long *)&Raw);
        local_140 = *puVar7;
        p_Var9 = (_Base_ptr)((long)local_270 + local_140);
        local_150 = (long)Raw.Data - local_140;
        puVar7 = std::min<unsigned_long>(&local_148,&local_150);
        pcVar1 = (char *)*puVar7;
        local_110 = local_130;
        It._M_node = p_Var9;
        local_120 = pcVar1;
        local_118 = p_Var9;
        pDVar4 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
                 operator->(this->Doc);
        pmVar5 = Document::getTagMap(pDVar4);
        local_358._M_node =
             (_Base_ptr)
             std::
             map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
             ::find(pmVar5,(key_type *)&It);
        pDVar4 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
                 operator->(this->Doc);
        pmVar5 = Document::getTagMap(pDVar4);
        local_360._M_node =
             (_Base_ptr)
             std::
             map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
             ::end(pmVar5);
        bVar10 = std::operator!=(&local_358,&local_360);
        if (bVar10) {
          ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>
                   ::operator->(&local_358);
          StringRef::operator_cast_to_string((string *)((long)&T.Value.field_2 + 8),&ppVar6->second)
          ;
          std::__cxx11::string::operator=
                    ((string *)__return_storage_ptr__,(string *)(T.Value.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(T.Value.field_2._M_local_buf + 8));
        }
        else {
          Token::Token((Token *)local_3b8);
          local_3b8._0_4_ = TK_Tag;
          T._0_8_ = It._M_node;
          T.Range.Data = pcVar1;
          Twine::Twine(&local_3e8,"Unknown tag handle ");
          Twine::Twine(&local_400,(StringRef *)&It);
          llvm::operator+(&local_3d0,&local_3e8,&local_400);
          setError(this,&local_3d0,(Token *)local_3b8);
          Token::~Token((Token *)local_3b8);
        }
        sVar3 = StringRef::find_last_of((StringRef *)local_270,'!',0xffffffffffffffff);
        local_198[2] = sVar3 + 1;
        local_198[1] = 0xffffffffffffffff;
        local_180 = (StringRef *)local_270;
        puVar7 = std::min<unsigned_long>(local_198 + 2,(unsigned_long *)&Raw);
        local_198[2] = *puVar7;
        psVar8 = (string *)((long)local_270 + local_198[2]);
        local_198[0] = (long)Raw.Data - local_198[2];
        puVar7 = std::min<unsigned_long>(local_198 + 1,local_198);
        local_408 = (char *)*puVar7;
        local_158 = local_178;
        string_01.Length = (size_t)psVar8;
        string_01.Data = local_408;
        local_410 = psVar8;
        local_168 = local_408;
        local_160 = psVar8;
        llvm::operator+=((llvm *)__return_storage_ptr__,psVar8,string_01);
      }
    }
  }
  else {
    uVar2 = getType(this);
    switch(uVar2) {
    case 0:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"tag:yaml.org,2002:null",&local_411);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      break;
    case 1:
    case 2:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"tag:yaml.org,2002:str",&local_412);
      std::allocator<char>::~allocator((allocator<char> *)&local_412);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_415);
      std::allocator<char>::~allocator((allocator<char> *)&local_415);
      break;
    case 4:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"tag:yaml.org,2002:map",&local_413);
      std::allocator<char>::~allocator((allocator<char> *)&local_413);
      break;
    case 5:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"tag:yaml.org,2002:seq",&local_414);
      std::allocator<char>::~allocator((allocator<char> *)&local_414);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::getVerbatimTag() const {
  StringRef Raw = getRawTag();
  if (!Raw.empty() && Raw != "!") {
    std::string Ret;
    if (Raw.find_last_of('!') == 0) {
      Ret = Doc->getTagMap().find("!")->second;
      Ret += Raw.substr(1);
      return Ret;
    } else if (Raw.startswith("!!")) {
      Ret = Doc->getTagMap().find("!!")->second;
      Ret += Raw.substr(2);
      return Ret;
    } else {
      StringRef TagHandle = Raw.substr(0, Raw.find_last_of('!') + 1);
      std::map<StringRef, StringRef>::const_iterator It =
          Doc->getTagMap().find(TagHandle);
      if (It != Doc->getTagMap().end())
        Ret = It->second;
      else {
        Token T;
        T.Kind = Token::TK_Tag;
        T.Range = TagHandle;
        setError(Twine("Unknown tag handle ") + TagHandle, T);
      }
      Ret += Raw.substr(Raw.find_last_of('!') + 1);
      return Ret;
    }
  }

  switch (getType()) {
  case NK_Null:
    return "tag:yaml.org,2002:null";
  case NK_Scalar:
  case NK_BlockScalar:
    // TODO: Tag resolution.
    return "tag:yaml.org,2002:str";
  case NK_Mapping:
    return "tag:yaml.org,2002:map";
  case NK_Sequence:
    return "tag:yaml.org,2002:seq";
  }

  return "";
}